

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O3

BOOL Js::JavascriptOperators::IsNumberFromNativeArray
               (Var instance,uint32 index,ScriptContext *scriptContext)

{
  Type TVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  int iVar5;
  JavascriptCopyOnAccessNativeIntArray *this;
  undefined4 *puVar6;
  RecyclableObject *pRVar7;
  Var local_38;
  Var member;
  
  if (instance == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar3) goto LAB_00aa52aa;
    *puVar6 = 0;
  }
  else {
    bVar3 = VarIs<Js::JavascriptCopyOnAccessNativeIntArray>(instance);
    if ((bVar3) &&
       (this = UnsafeVarTo<Js::JavascriptCopyOnAccessNativeIntArray>(instance),
       this != (JavascriptCopyOnAccessNativeIntArray *)0x0)) {
      JavascriptCopyOnAccessNativeIntArray::ConvertCopyOnAccessSegment(this);
    }
    if (((ulong)instance & 0x1ffff00000000) != 0x1000000000000 &&
        ((ulong)instance & 0xffff000000000000) == 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                  "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (bVar3) {
        *puVar6 = 0;
        return 0;
      }
      goto LAB_00aa52aa;
    }
    if ((ulong)instance >> 0x32 != 0 || ((ulong)instance & 0xffff000000000000) == 0x1000000000000) {
      return 0;
    }
  }
  pRVar7 = UnsafeVarTo<Js::RecyclableObject>(instance);
  if (pRVar7 == (RecyclableObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
    if (!bVar3) goto LAB_00aa52aa;
    *puVar6 = 0;
  }
  TVar1 = ((pRVar7->type).ptr)->typeId;
  if ((0x57 < (int)TVar1) && (BVar4 = RecyclableObject::IsExternal(pRVar7), BVar4 == 0)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                "GetTypeId aValue has invalid TypeId");
    if (!bVar3) {
LAB_00aa52aa:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
  if ((TVar1 != TypeIds_NativeIntArray) && (TVar1 != TypeIds_ArrayLast)) {
    if (10 < TVar1 - TypeIds_Int8Array) {
      return 0;
    }
    BVar4 = TypedArrayBase::IsDetachedTypedArray(instance);
    if (BVar4 != 0) {
      return 0;
    }
  }
  pRVar7 = VarTo<Js::RecyclableObject>(instance);
  local_38 = (Var)0x0;
  iVar5 = (*(pRVar7->super_FinalizableObject).super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x26])(pRVar7,pRVar7,(ulong)index,&local_38,scriptContext);
  if ((iVar5 == 1) && (BVar4 = IsUndefined(local_38), BVar4 == 0)) {
    return 1;
  }
  return 0;
}

Assistant:

BOOL JavascriptOperators::IsNumberFromNativeArray(Var instance, uint32 index, ScriptContext* scriptContext)
    {
#if ENABLE_COPYONACCESS_ARRAY
        JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<Var>(instance);
#endif
        Js::TypeId instanceType = JavascriptOperators::GetTypeId(instance);
        // Fast path for native and typed arrays.
        bool isNativeArray = instanceType == TypeIds_NativeIntArray || instanceType == TypeIds_NativeFloatArray;
        bool isTypedArray = instanceType >= TypeIds_Int8Array && instanceType <= TypeIds_Uint64Array;
        if (isNativeArray || isTypedArray)
        {
            // Check if the typed array is detached to prevent an exception in GetOwnItem
            if (isTypedArray && TypedArrayBase::IsDetachedTypedArray(instance))
            {
                return FALSE;
            }
            RecyclableObject* object = VarTo<RecyclableObject>(instance);
            Var member = nullptr;

            // If the item is found in the array own body, then it is a number
            if (JavascriptOperators::GetOwnItem(object, index, &member, scriptContext)
                && !JavascriptOperators::IsUndefined(member))
            {
                return TRUE;
            }
        }
        return FALSE;
    }